

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void DLevelScript::ChangeFlat(int tag,int name,bool floorOrCeiling)

{
  int iVar1;
  int pos;
  FSectorTagIterator it;
  char *flatname;
  FTextureID local_18;
  int secnum;
  FTextureID flat;
  bool floorOrCeiling_local;
  int name_local;
  int tag_local;
  
  secnum._3_1_ = floorOrCeiling;
  flat.texnum = name;
  FTextureID::FTextureID(&local_18);
  register0x00000000 = FBehavior::StaticLookupString(flat.texnum);
  if (register0x00000000 != (char *)0x0) {
    it.searchtag = (int)FTextureManager::GetTexture(&TexMan,register0x00000000,2,2);
    local_18 = (FTextureID)it.searchtag;
    FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&stack0xffffffffffffffcc,tag);
    while (iVar1 = FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffffcc),
          -1 < iVar1) {
      sector_t::SetTexture
                ((sector_t *)(sectors + iVar1),(uint)((secnum._3_1_ & 1) != 0),local_18,true);
    }
  }
  return;
}

Assistant:

void DLevelScript::ChangeFlat (int tag, int name, bool floorOrCeiling)
{
	FTextureID flat;
	int secnum = -1;
	const char *flatname = FBehavior::StaticLookupString (name);

	if (flatname == NULL)
		return;

	flat = TexMan.GetTexture (flatname, FTexture::TEX_Flat, FTextureManager::TEXMAN_Overridable);

	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		int pos = floorOrCeiling? sector_t::ceiling : sector_t::floor;
		sectors[secnum].SetTexture(pos, flat);
	}
}